

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

void __thiscall
icu_63::ChineseCalendar::add
          (ChineseCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t moon;
  int32_t day;
  int32_t dom;
  UErrorCode *status_local;
  int32_t amount_local;
  UCalendarDateFields field_local;
  ChineseCalendar *this_local;
  
  if (field == UCAL_MONTH) {
    if (amount != 0) {
      uVar2 = Calendar::get(&this->super_Calendar,UCAL_DATE,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        iVar3 = Calendar::get(&this->super_Calendar,UCAL_JULIAN_DAY,status);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          (*(this->super_Calendar).super_UObject._vptr_UObject[0x3a])
                    (this,(ulong)((iVar3 - uVar2) - 0x253d8b),(ulong)uVar2,(ulong)(uint)amount);
        }
      }
    }
  }
  else {
    Calendar::add(&this->super_Calendar,field,amount,status);
  }
  return;
}

Assistant:

void ChineseCalendar::add(UCalendarDateFields field, int32_t amount, UErrorCode& status) {
    switch (field) {
    case UCAL_MONTH:
        if (amount != 0) {
            int32_t dom = get(UCAL_DAY_OF_MONTH, status);
            if (U_FAILURE(status)) break;
            int32_t day = get(UCAL_JULIAN_DAY, status) - kEpochStartAsJulianDay; // Get local day
            if (U_FAILURE(status)) break;
            int32_t moon = day - dom + 1; // New moon 
            offsetMonth(moon, dom, amount);
        }
        break;
    default:
        Calendar::add(field, amount, status);
        break;
    }
}